

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

bool __thiscall
Memory::LargeHeapBlock::FindImplicitRootObject
          (LargeHeapBlock *this,void *objectAddress,Recycler *recycler,
          RecyclerHeapObjectInfo *heapObject)

{
  bool bVar1;
  BOOL BVar2;
  RecyclerHeapObjectInfo local_60;
  LargeObjectHeader *local_38;
  LargeObjectHeader *pHeader;
  RecyclerHeapObjectInfo *heapObject_local;
  Recycler *recycler_local;
  void *objectAddress_local;
  LargeHeapBlock *this_local;
  
  pHeader = (LargeObjectHeader *)heapObject;
  heapObject_local = (RecyclerHeapObjectInfo *)recycler;
  recycler_local = (Recycler *)objectAddress;
  objectAddress_local = this;
  BVar2 = IsValidObject(this,objectAddress);
  if (BVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_38 = (LargeObjectHeader *)0x0;
    bVar1 = GetObjectHeader(this,recycler_local,&local_38);
    if (bVar1) {
      RecyclerHeapObjectInfo::RecyclerHeapObjectInfo
                (&local_60,recycler_local,(Recycler *)heapObject_local,&this->super_HeapBlock,
                 (byte *)0x0);
      memcpy(pHeader,&local_60,0x21);
      RecyclerHeapObjectInfo::SetLargeHeapBlockHeader((RecyclerHeapObjectInfo *)pHeader,local_38);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
LargeHeapBlock::FindImplicitRootObject(void* objectAddress, Recycler * recycler, RecyclerHeapObjectInfo& heapObject)
{
    if (!IsValidObject(objectAddress))
    {
        return false;
    }

    LargeObjectHeader* pHeader = nullptr;

    if (!GetObjectHeader(objectAddress, &pHeader))
    {
        return false;
    }

#ifdef LARGEHEAPBLOCK_ENCODING
    heapObject = RecyclerHeapObjectInfo(objectAddress, recycler, this, nullptr);
    heapObject.SetLargeHeapBlockHeader(pHeader);
#else
    heapObject = RecyclerHeapObjectInfo(objectAddress, recycler, this, pHeader->GetAttributesPtr());
#endif
    return true;
}